

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O1

any * __thiscall Omega_h::TernaryOp::eval(any *__return_storage_ptr__,TernaryOp *this,ExprEnv *env)

{
  LO size;
  Int dim;
  element_type *peVar1;
  any rhs_val;
  any lhs_val;
  storage_union local_70;
  long local_60;
  storage_union local_58;
  long local_48;
  storage_union local_40;
  long local_30;
  
  (*((this->lhs).super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ExprOp[2])(&local_58);
  peVar1 = (this->rhs).super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_ExprOp[2])(&local_70,peVar1,env);
  anon_unknown_41::promote(env->size,env->dim,(any *)&local_58,(any *)&local_70);
  size = env->size;
  dim = env->dim;
  peVar1 = (this->cond).super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_ExprOp[2])(&local_40,peVar1,env);
  anon_unknown_41::ternary
            (__return_storage_ptr__,size,dim,(any *)&local_40,(any *)&local_58,(any *)&local_70);
  if (local_30 != 0) {
    (**(code **)(local_30 + 8))(&local_40);
    local_30 = 0;
  }
  if (local_60 != 0) {
    (**(code **)(local_60 + 8))(&local_70);
    local_60 = 0;
  }
  if (local_48 != 0) {
    (**(code **)(local_48 + 8))(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

any TernaryOp::eval(ExprEnv& env) {
  auto lhs_val = lhs->eval(env);
  auto rhs_val = rhs->eval(env);
  promote(env.size, env.dim, lhs_val, rhs_val);
  return ternary(env.size, env.dim, cond->eval(env), lhs_val, rhs_val);
}